

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O0

void __thiscall OpenSketch<4U>::~OpenSketch(OpenSketch<4U> *this)

{
  Abstract<4U> *pAVar1;
  long lVar2;
  undefined8 *in_RDI;
  Abstract<4U> *in_stack_ffffffffffffffc0;
  Abstract<4U> *this_00;
  
  *in_RDI = &PTR_Init_00123cb0;
  if ((void *)in_RDI[0x19] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0x19]);
  }
  pAVar1 = (Abstract<4U> *)in_RDI[0x10];
  if (pAVar1 != (Abstract<4U> *)0x0) {
    lVar2 = *(long *)&pAVar1[-1].HIT;
    this_00 = (Abstract<4U> *)(&pAVar1->_vptr_Abstract + lVar2 * 2);
    while (pAVar1 != this_00) {
      this_00 = (Abstract<4U> *)&this_00[-1].field_0x60;
      BitSet::~BitSet((BitSet *)this_00);
      in_stack_ffffffffffffffc0 = this_00;
    }
    operator_delete__(&pAVar1[-1].HIT,lVar2 * 0x10 + 8);
  }
  if ((void *)in_RDI[0x11] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0x11]);
  }
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x114d90);
  Abstract<4U>::~Abstract(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

~OpenSketch() {
		delete[] heap;
		delete[] bitset;
		delete[] counter;
	}